

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O2

int __thiscall Epoll::modify_event(Epoll *this,int fd,int state)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  epoll_event ev;
  
  ev.events = state;
  ev.data.fd = fd;
  iVar1 = epoll_ctl(this->_epfd,3,fd,(epoll_event *)&ev);
  __stream = _stderr;
  iVar2 = 0;
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(__stream,"%s(%d)-<%s>: epoll_ctl modify fd:%d failed! error: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Epoll.cpp"
            ,0x2d,"modify_event",fd,pcVar4);
    fflush(_stderr);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Epoll::modify_event(const int fd, const int state)
{
    struct epoll_event ev;
    ev.events = state;
    ev.data.fd = fd;
    int ret = epoll_ctl(_epfd, EPOLL_CTL_MOD, fd, &ev);
    if (ret < 0)
    {
        LOG_PRINT("epoll_ctl modify fd:%d failed! error: %s", fd, strerror(errno));
        // exit(EXIT_FAILURE);
        return -1;
    }

    return 0;
}